

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::beginQueries
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint i;
  ulong uVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x20))(0x82ec,this->m_overflow_query);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar1) {
    for (uVar3 = 0;
        uVar3 < (this->super_TransformFeedbackOverflowQueryBaseTest).m_max_vertex_streams;
        uVar3 = uVar3 + 1) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x28))
                (0x82ed,uVar3 & 0xffffffff,this->m_stream_overflow_query[uVar3]);
    }
  }
  return;
}

Assistant:

void beginQueries()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_overflow_query);

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_stream_overflow_query[i]);
			}
		}
	}